

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

void __thiscall ValueType::ToString(ValueType *this,wchar (*str) [256])

{
  int local_11c;
  char local_118 [4];
  int i;
  char charStr [256];
  wchar (*str_local) [256];
  ValueType *this_local;
  
  charStr._248_8_ = str;
  ToString(this,(char (*) [256])local_118);
  for (local_11c = 0;
      (local_11c < 0x100 &&
      (*(short *)(charStr._248_8_ + (long)local_11c * 2) = (short)local_118[local_11c],
      local_118[local_11c] != '\0')); local_11c = local_11c + 1) {
  }
  return;
}

Assistant:

void ValueType::ToString(wchar (&str)[VALUE_TYPE_MAX_STRING_SIZE]) const
{
    char charStr[VALUE_TYPE_MAX_STRING_SIZE];
    ToString(charStr);
    for(int i = 0; i < VALUE_TYPE_MAX_STRING_SIZE; ++i)
    {
        str[i] = charStr[i];
        if(!charStr[i])
            break;
    }
}